

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

int Gia_ManCorrSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  uVar2 = *(ulong *)pObj;
  if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar2) {
    Gia_ManCorrSpecReduce_rec(pNew,p,pObj + -(uVar2 & 0x1fffffff),f,nPrefix);
    Gia_ManCorrSpecReduce_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),f,nPrefix);
    uVar2 = *(ulong *)pObj;
    pGVar6 = pObj + -(uVar2 & 0x1fffffff);
    pGVar4 = p->pObjs;
    if (pGVar4 <= pGVar6) {
      if (pGVar6 < pGVar4 + p->nObjs) {
        iVar8 = p->nObjs * f;
        uVar10 = (int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555 + iVar8;
        if (((int)uVar10 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)uVar10))
        goto LAB_005c6b20;
        piVar5 = (p->vCopies).pArray;
        uVar10 = piVar5[uVar10];
        if (-1 < (int)uVar10) {
          uVar7 = (uint)(uVar2 >> 0x20);
          pGVar6 = pObj + -(ulong)(uVar7 & 0x1fffffff);
          if ((pGVar6 < pGVar4) || (pGVar4 + p->nObjs <= pGVar6)) goto LAB_005c6b3f;
          uVar9 = iVar8 + (int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555;
          if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_005c6b20;
          uVar9 = piVar5[uVar9];
          if (-1 < (int)uVar9) {
            iVar8 = Gia_ManHashAnd(pNew,uVar10 ^ (uint)(uVar2 >> 0x1d) & 1,uVar9 ^ uVar7 >> 0x1d & 1
                                  );
            return iVar8;
          }
        }
LAB_005c6b5e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
    }
LAB_005c6b3f:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar7 = (uint)uVar2 & 0x9fffffff;
  uVar10 = (uint)(uVar2 >> 0x20);
  if (f == 0) {
    if ((uVar7 != 0x9fffffff) || ((int)(uVar10 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x39,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    pGVar6 = p->pObjs;
    if ((pObj < pGVar6) || (pGVar6 + p->nObjs <= pObj)) goto LAB_005c6b3f;
    uVar10 = (int)((long)pObj - (long)pGVar6 >> 2) * -0x55555555;
    if ((-1 < (int)uVar10) && ((int)uVar10 < (p->vCopies).nSize)) {
      return (p->vCopies).pArray[uVar10 & 0x7fffffff];
    }
  }
  else {
    if ((uVar7 != 0x9fffffff) || ((int)(uVar10 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      __assert_fail("f && Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x3c,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    iVar8 = p->vCis->nSize;
    if ((int)(uVar10 & 0x1fffffff) < iVar8 - p->nRegs) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = p->vCos->nSize;
    uVar10 = (iVar1 - iVar8) + (uVar10 & 0x1fffffff);
    if ((-1 < (int)uVar10) && ((int)uVar10 < iVar1)) {
      iVar8 = p->vCos->pArray[uVar10];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pObjs + iVar8;
      Gia_ManCorrSpecReduce_rec(pNew,p,pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff),f + -1,nPrefix);
      pGVar4 = pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff);
      pGVar3 = p->pObjs;
      if ((pGVar4 < pGVar3) || (pGVar3 + p->nObjs <= pGVar4)) goto LAB_005c6b3f;
      uVar10 = (int)((ulong)((long)pGVar4 - (long)pGVar3) >> 2) * -0x55555555 + p->nObjs * (f + -1);
      if ((-1 < (int)uVar10) && ((int)uVar10 < (p->vCopies).nSize)) {
        uVar10 = (p->vCopies).pArray[uVar10];
        if (-1 < (int)uVar10) {
          return uVar10 ^ (uint)(*(ulong *)pGVar6 >> 0x1d) & 1;
        }
        goto LAB_005c6b5e;
      }
    }
  }
LAB_005c6b20:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_ManCorrSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f, nPrefix );
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj), f, nPrefix );
        return Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj) );
    }
    if ( f == 0 )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        return Gia_ObjCopyF(p, f, pObj);
    }
    assert( f && Gia_ObjIsRo(p, pObj) );
    pObj = Gia_ObjRoToRi( p, pObj );
    Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f-1, nPrefix );
    return Gia_ObjFanin0CopyF( p, f-1, pObj );
}